

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O0

void __thiscall
duckdb::TopNHeap::AddSmallHeap(TopNHeap *this,DataChunk *input,Vector *sort_keys_vec)

{
  bool bVar1;
  string_t *psVar2;
  reference pTVar3;
  idx_t iVar4;
  DataChunk *in_RSI;
  TopNHeap *in_RDI;
  TopNEntry *entry_1;
  iterator __end1;
  iterator __begin1;
  unsafe_vector<TopNEntry> *__range1;
  idx_t match_count;
  TopNEntry entry;
  string_t *sort_key;
  idx_t r;
  string_t *sort_key_values;
  DataChunk *in_stack_00000080;
  bool any_added;
  idx_t BASE_INDEX;
  vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_> *in_stack_ffffffffffffff58;
  string_t *sort_key_00;
  anon_union_16_2_67f50693_for_value in_stack_ffffffffffffff70;
  TopNHeap *in_stack_ffffffffffffff80;
  __normal_iterator<duckdb::TopNEntry_*,_std::vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>_>
  local_70;
  unsafe_vector<TopNEntry> *local_68;
  long local_60;
  undefined8 local_58;
  char *local_50;
  undefined1 *local_48;
  string_t *local_40;
  string_t *local_38;
  string_t *local_30;
  byte local_21;
  undefined8 local_20;
  DataChunk *local_10;
  
  local_20 = 0xffffffff;
  local_21 = 0;
  local_10 = in_RSI;
  local_30 = FlatVector::GetData<duckdb::string_t>((Vector *)0x184f06e);
  local_38 = (string_t *)0x0;
  while (sort_key_00 = local_38, psVar2 = (string_t *)DataChunk::size(local_10),
        sort_key_00 < psVar2) {
    local_40 = local_30 + (long)local_38;
    bVar1 = EntryShouldBeAdded(in_RDI,sort_key_00);
    if (bVar1) {
      local_58 = *(undefined8 *)&local_40->value;
      local_50 = (local_40->value).pointer.ptr;
      local_48 = (undefined1 *)((long)&local_38[0xfffffff].value + 0xf);
      AddEntryToHeap(in_stack_ffffffffffffff80,(TopNEntry *)in_stack_ffffffffffffff70.pointer.ptr);
      local_21 = 1;
    }
    local_38 = (string_t *)((long)&local_38->value + 1);
  }
  if ((local_21 & 1) != 0) {
    local_60 = 0;
    local_68 = &in_RDI->heap;
    local_70._M_current =
         (TopNEntry *)
         ::std::vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>::begin
                   (in_stack_ffffffffffffff58);
    ::std::vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>::end
              (in_stack_ffffffffffffff58);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<duckdb::TopNEntry_*,_std::vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>_>
                               *)sort_key_00,
                              (__normal_iterator<duckdb::TopNEntry_*,_std::vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>_>
                               *)in_stack_ffffffffffffff58), bVar1) {
      pTVar3 = __gnu_cxx::
               __normal_iterator<duckdb::TopNEntry_*,_std::vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>_>
               ::operator*(&local_70);
      if (0xfffffffe < pTVar3->index) {
        bVar1 = string_t::IsInlined((string_t *)0x184f1a9);
        if (!bVar1) {
          in_stack_ffffffffffffff70.pointer =
               (anon_struct_16_3_d7536bce_for_pointer)
               StringHeap::AddBlob(in_stack_ffffffffffffff70._0_8_,(string_t *)in_RDI);
          *(long *)&(pTVar3->sort_key).value = in_stack_ffffffffffffff70._0_8_;
          (pTVar3->sort_key).value.pointer.ptr = in_stack_ffffffffffffff70._8_8_;
        }
        SelectionVector::set_index(in_stack_ffffffffffffff70._0_8_,(idx_t)in_RDI,(idx_t)sort_key_00)
        ;
        iVar4 = DataChunk::size(&in_RDI->heap_data);
        pTVar3->index = iVar4 + local_60;
        local_60 = local_60 + 1;
      }
      __gnu_cxx::
      __normal_iterator<duckdb::TopNEntry_*,_std::vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>_>
      ::operator++(&local_70);
    }
    DataChunk::Append(in_stack_00000080,(DataChunk *)sort_key_values,r._7_1_,
                      (SelectionVector *)sort_key,entry.index);
  }
  return;
}

Assistant:

void TopNHeap::AddSmallHeap(DataChunk &input, Vector &sort_keys_vec) {
	// insert the sort keys into the priority queue
	constexpr idx_t BASE_INDEX = NumericLimits<uint32_t>::Maximum();

	bool any_added = false;
	auto sort_key_values = FlatVector::GetData<string_t>(sort_keys_vec);
	for (idx_t r = 0; r < input.size(); r++) {
		auto &sort_key = sort_key_values[r];
		if (!EntryShouldBeAdded(sort_key)) {
			continue;
		}
		// replace the previous top entry with the new entry
		TopNEntry entry;
		entry.sort_key = sort_key;
		entry.index = BASE_INDEX + r;
		AddEntryToHeap(entry);
		any_added = true;
	}
	if (!any_added) {
		// early-out: no matches
		return;
	}

	// for all matching entries we need to copy over the corresponding payload values
	idx_t match_count = 0;
	for (auto &entry : heap) {
		if (entry.index < BASE_INDEX) {
			continue;
		}
		// this entry was added in this chunk
		// if not inlined - copy over the string to the string heap
		if (!entry.sort_key.IsInlined()) {
			entry.sort_key = sort_key_heap.AddBlob(entry.sort_key);
		}
		// to finalize the addition of this entry we need to move over the payload data
		matching_sel.set_index(match_count, entry.index - BASE_INDEX);
		entry.index = heap_data.size() + match_count;
		match_count++;
	}

	// copy over the input rows to the payload chunk
	heap_data.Append(input, true, &matching_sel, match_count);
}